

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::operator[](JSONNode *this,json_index_t pos)

{
  internalJSONNode *piVar1;
  json_index_t jVar2;
  json_index_t jVar3;
  JSONNode *pJVar4;
  allocator local_71;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  json_index_t local_14;
  JSONNode *pJStack_10;
  json_index_t pos_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_14 = pos;
  pJStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  jVar2 = local_14;
  jVar3 = internalJSONNode::size(this->internal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"[] const out of bounds",&local_71);
  JSONDebug::_JSON_ASSERT(jVar2 < jVar3,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pJVar4 = internalJSONNode::at(this->internal,local_14);
  return pJVar4;
}

Assistant:

const JSONNode & JSONNode::operator[](json_index_t pos) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(pos < internal -> size(), JSON_TEXT("[] const out of bounds"));
    return *(internal -> at(pos));
}